

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_readline(lua_State *L)

{
  code *pcVar1;
  int iVar2;
  undefined8 *puVar3;
  lua_Integer lVar4;
  char *pcVar5;
  void *pvVar6;
  int iVar7;
  
  puVar3 = (undefined8 *)lua_touserdata(L,-0xf4629);
  lVar4 = lua_tointegerx(L,-0xf462a,(int *)0x0);
  if (puVar3[1] == 0) {
    iVar7 = luaL_error(L,"file is already closed");
    return iVar7;
  }
  lua_settop(L,1);
  if (0 < (int)lVar4) {
    iVar7 = -0xf462c;
    do {
      lua_pushvalue(L,iVar7);
      iVar2 = (int)lVar4 + iVar7;
      iVar7 = iVar7 + -1;
    } while (iVar2 != -0xf462b);
  }
  iVar7 = g_read(L,(FILE *)*puVar3,2);
  iVar2 = lua_type(L,-iVar7);
  if (iVar2 == 0) {
    if (1 < iVar7) {
      pcVar5 = lua_tolstring(L,1 - iVar7,(size_t *)0x0);
      iVar7 = luaL_error(L,"%s",pcVar5);
      return iVar7;
    }
    iVar2 = lua_toboolean(L,-0xf462b);
    iVar7 = 0;
    if (iVar2 != 0) {
      lua_settop(L,0);
      lua_pushvalue(L,-0xf4629);
      pvVar6 = luaL_checkudata(L,1,"FILE*");
      pcVar1 = *(code **)((long)pvVar6 + 8);
      *(undefined8 *)((long)pvVar6 + 8) = 0;
      (*pcVar1)(L);
    }
  }
  return iVar7;
}

Assistant:

static int io_readline (lua_State *L) {
  LStream *p = (LStream *)lua_touserdata(L, lua_upvalueindex(1));
  int i;
  int n = (int)lua_tointeger(L, lua_upvalueindex(2));
  if (isclosed(p))  /* file is already closed? */
    return luaL_error(L, "file is already closed");
  lua_settop(L , 1);
  for (i = 1; i <= n; i++)  /* push arguments to 'g_read' */
    lua_pushvalue(L, lua_upvalueindex(3 + i));
  n = g_read(L, p->f, 2);  /* 'n' is number of results */
  lua_assert(n > 0);  /* should return at least a nil */
  if (!lua_isnil(L, -n))  /* read at least one value? */
    return n;  /* return them */
  else {  /* first result is nil: EOF or error */
    if (n > 1) {  /* is there error information? */
      /* 2nd result is error message */
      return luaL_error(L, "%s", lua_tostring(L, -n + 1));
    }
    if (lua_toboolean(L, lua_upvalueindex(3))) {  /* generator created file? */
      lua_settop(L, 0);
      lua_pushvalue(L, lua_upvalueindex(1));
      aux_close(L);  /* close it */
    }
    return 0;
  }
}